

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# delta_length_byte_array_decoder.cpp
# Opt level: O0

void __thiscall
duckdb::DeltaLengthByteArrayDecoder::ReadInternal<false>
          (DeltaLengthByteArrayDecoder *this,shared_ptr<duckdb::ResizeableBuffer,_true> *block_ref,
          uint8_t *defines,idx_t read_count,Vector *result,idx_t result_offset)

{
  idx_t iVar1;
  undefined8 uVar2;
  long lVar3;
  uint *puVar4;
  shared_ptr<duckdb::ResizeableBuffer,_true> *in_RCX;
  StringColumnReader *in_RDI;
  long in_R9;
  uint32_t *str_len;
  idx_t result_idx;
  idx_t row_idx;
  data_ptr_t start_ptr;
  ValidityMask *result_mask;
  string_t *result_data;
  uint32_t *length_data;
  ResizeableBuffer *block;
  shared_ptr<duckdb::ResizeableBuffer,_true> *in_stack_ffffffffffffff30;
  uint32_t str_len_00;
  char *in_stack_ffffffffffffff38;
  allocator *paVar5;
  char *in_stack_ffffffffffffff48;
  string_t *in_stack_ffffffffffffff50;
  unsigned_long in_stack_ffffffffffffff68;
  shared_ptr<duckdb::ResizeableBuffer,_true> *block_00;
  unsigned_long in_stack_ffffffffffffff70;
  ColumnReader *this_00;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 uVar6;
  undefined4 in_stack_ffffffffffffff7c;
  IOException *in_stack_ffffffffffffff80;
  allocator local_71;
  string local_70 [32];
  ValidityMask *local_50;
  string_t *local_48;
  long local_40;
  type local_38;
  long local_30;
  shared_ptr<duckdb::ResizeableBuffer,_true> *local_20;
  
  local_30 = in_R9;
  local_20 = in_RCX;
  local_38 = shared_ptr<duckdb::ResizeableBuffer,_true>::operator*(in_stack_ffffffffffffff30);
  local_40 = *(long *)(in_RDI->super_ColumnReader).column_schema;
  local_48 = FlatVector::GetData<duckdb::string_t>((Vector *)0x8528fd);
  local_50 = FlatVector::Validity((Vector *)0x852912);
  if ((in_RDI->super_ColumnReader).reader <
      (ParquetReader *)
      ((long)&(local_20->internal).
              super___shared_ptr<duckdb::ResizeableBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
      (in_RDI->super_ColumnReader).pending_skips)) {
    uVar6 = CONCAT13(1,(int3)in_stack_ffffffffffffff78);
    uVar2 = __cxa_allocate_exception(0x10);
    paVar5 = &local_71;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_70,
               "DELTA_LENGTH_BYTE_ARRAY - length mismatch between values and byte array lengths (attempted read of %d from %d entries) - corrupt file?"
               ,paVar5);
    IOException::IOException<unsigned_long,unsigned_long>
              (in_stack_ffffffffffffff80,(string *)CONCAT44(in_stack_ffffffffffffff7c,uVar6),
               in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    __cxa_throw(uVar2,&IOException::typeinfo,IOException::~IOException);
  }
  this_00 = (ColumnReader *)(local_38->super_ByteBuffer).ptr;
  for (block_00 = (shared_ptr<duckdb::ResizeableBuffer,_true> *)0x0;
      str_len_00 = (uint32_t)((ulong)in_stack_ffffffffffffff30 >> 0x20), block_00 < local_20;
      block_00 = (shared_ptr<duckdb::ResizeableBuffer,_true> *)
                 ((long)&(block_00->internal).
                         super___shared_ptr<duckdb::ResizeableBuffer,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr + 1)) {
    lVar3 = (long)&(block_00->internal).
                   super___shared_ptr<duckdb::ResizeableBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
            local_30;
    iVar1 = (in_RDI->super_ColumnReader).pending_skips;
    (in_RDI->super_ColumnReader).pending_skips = iVar1 + 1;
    puVar4 = (uint *)(local_40 + iVar1 * 4);
    char_ptr_cast<unsigned_char>((local_38->super_ByteBuffer).ptr);
    string_t::string_t(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
                       (uint32_t)((ulong)in_RDI >> 0x20));
    *(char **)&local_48[lVar3].value = in_stack_ffffffffffffff48;
    local_48[lVar3].value.pointer.ptr = (char *)in_stack_ffffffffffffff50;
    ByteBuffer::unsafe_inc(&local_38->super_ByteBuffer,(ulong)*puVar4);
  }
  ColumnReader::Cast<duckdb::StringColumnReader>(this_00);
  char_ptr_cast<unsigned_char>((uchar *)this_00);
  StringColumnReader::VerifyString(in_RDI,in_stack_ffffffffffffff38,str_len_00);
  StringColumnReader::ReferenceBlock((Vector *)this_00,block_00);
  return;
}

Assistant:

void DeltaLengthByteArrayDecoder::ReadInternal(shared_ptr<ResizeableBuffer> &block_ref, uint8_t *const defines,
                                               const idx_t read_count, Vector &result, const idx_t result_offset) {
	auto &block = *block_ref;
	const auto length_data = reinterpret_cast<uint32_t *>(length_buffer.ptr);
	auto result_data = FlatVector::GetData<string_t>(result);
	auto &result_mask = FlatVector::Validity(result);

	if (!HAS_DEFINES) {
		// Fast path: take this out of the loop below
		if (length_idx + read_count > byte_array_count) {
			throw IOException(
			    "DELTA_LENGTH_BYTE_ARRAY - length mismatch between values and byte array lengths (attempted "
			    "read of %d from %d entries) - corrupt file?",
			    length_idx + read_count, byte_array_count);
		}
	}

	const auto start_ptr = block.ptr;
	for (idx_t row_idx = 0; row_idx < read_count; row_idx++) {
		const auto result_idx = result_offset + row_idx;
		if (HAS_DEFINES) {
			if (defines[result_idx] != reader.MaxDefine()) {
				result_mask.SetInvalid(result_idx);
				continue;
			}
			if (length_idx >= byte_array_count) {
				throw IOException(
				    "DELTA_LENGTH_BYTE_ARRAY - length mismatch between values and byte array lengths (attempted "
				    "read of %d from %d entries) - corrupt file?",
				    length_idx, byte_array_count);
			}
		}
		const auto &str_len = length_data[length_idx++];
		result_data[result_idx] = string_t(char_ptr_cast(block.ptr), str_len);
		block.unsafe_inc(str_len);
	}

	// Verify that the strings we read are valid UTF-8
	reader.Cast<StringColumnReader>().VerifyString(char_ptr_cast(start_ptr), block.ptr - start_ptr);

	StringColumnReader::ReferenceBlock(result, block_ref);
}